

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_catalog_entry.cpp
# Opt level: O2

void duckdb::LogicalUpdate::BindExtraColumns
               (TableCatalogEntry *table,LogicalGet *get,LogicalProjection *proj,
               LogicalUpdate *update,physical_index_set_t *bound_columns)

{
  size_type *__k;
  idx_t iVar1;
  reference pvVar2;
  iterator iVar3;
  ColumnDefinition *this;
  LogicalType *pLVar4;
  vector<duckdb::ColumnIndex,_true> *pvVar5;
  __node_base *p_Var6;
  idx_t i;
  ulong __n;
  size_type sVar7;
  physical_index_set_t found_columns;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_b0;
  Expression *local_a8;
  vector<duckdb::PhysicalIndex,_true> *local_a0;
  LogicalProjection *local_98;
  TableCatalogEntry *local_90;
  LogicalGet *local_88;
  ColumnBinding local_80;
  vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
  *local_70;
  _Hashtable<duckdb::PhysicalIndex,_duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::PhysicalIndex>,_duckdb::PhysicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  if (1 < (bound_columns->_M_h)._M_element_count) {
    local_68._M_buckets = &local_68._M_single_bucket;
    local_68._M_bucket_count = 1;
    local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_68._M_element_count = 0;
    local_68._M_rehash_policy._M_max_load_factor = 1.0;
    local_68._M_rehash_policy._M_next_resize = 0;
    local_68._M_single_bucket = (__node_base_ptr)0x0;
    local_a0 = &update->columns;
    sVar7 = 0;
    local_98 = proj;
    local_90 = table;
    local_88 = get;
    for (__n = 0; __n < (ulong)((long)(update->columns).
                                      super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                      .
                                      super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(update->columns).
                                      super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                      .
                                      super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3); __n = __n + 1
        ) {
      pvVar2 = vector<duckdb::PhysicalIndex,_true>::get<true>(local_a0,__n);
      iVar3 = ::std::
              _Hashtable<duckdb::PhysicalIndex,_duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::PhysicalIndex>,_duckdb::PhysicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find(&bound_columns->_M_h,pvVar2);
      if (iVar3.super__Node_iterator_base<duckdb::PhysicalIndex,_true>._M_cur != (__node_type *)0x0)
      {
        pvVar2 = vector<duckdb::PhysicalIndex,_true>::get<true>(local_a0,__n);
        ::std::__detail::
        _Insert_base<duckdb::PhysicalIndex,_duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::PhysicalIndex>,_duckdb::PhysicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::insert((_Insert_base<duckdb::PhysicalIndex,_duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::PhysicalIndex>,_duckdb::PhysicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  *)&local_68,pvVar2);
        sVar7 = sVar7 + 1;
      }
    }
    if ((sVar7 != 0) && (sVar7 != (bound_columns->_M_h)._M_element_count)) {
      p_Var6 = &(bound_columns->_M_h)._M_before_begin;
      local_90 = (TableCatalogEntry *)&local_90->columns;
      local_70 = (vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&(local_98->super_LogicalOperator).expressions;
      while (p_Var6 = p_Var6->_M_nxt, p_Var6 != (__node_base *)0x0) {
        __k = (size_type *)(p_Var6 + 1);
        iVar3 = ::std::
                _Hashtable<duckdb::PhysicalIndex,_duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::PhysicalIndex>,_duckdb::PhysicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::find(&local_68,(key_type *)__k);
        if (iVar3.super__Node_iterator_base<duckdb::PhysicalIndex,_true>._M_cur ==
            (__node_type *)0x0) {
          this = ColumnList::GetColumn((ColumnList *)local_90,(idx_t)*__k);
          pLVar4 = ColumnDefinition::Type(this);
          local_80.table_index = local_98->table_index;
          local_80.column_index =
               (long)(local_98->super_LogicalOperator).expressions.
                     super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(local_98->super_LogicalOperator).expressions.
                     super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3;
          make_uniq<duckdb::BoundColumnRefExpression,duckdb::LogicalType_const&,duckdb::ColumnBinding>
                    ((duckdb *)&local_a8,pLVar4,&local_80);
          local_b0._M_head_impl = local_a8;
          local_a8 = (Expression *)0x0;
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                      *)&(update->super_LogicalOperator).expressions,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)&local_b0);
          if (local_b0._M_head_impl != (Expression *)0x0) {
            (*((local_b0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
          }
          local_b0._M_head_impl = (Expression *)0x0;
          if (local_a8 != (Expression *)0x0) {
            (*(local_a8->super_BaseExpression)._vptr_BaseExpression[1])();
          }
          pLVar4 = ColumnDefinition::Type(this);
          iVar1 = local_88->table_index;
          pvVar5 = LogicalGet::GetColumnIds(local_88);
          local_80.column_index =
               (long)(pvVar5->
                     super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
                     super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(pvVar5->
                     super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
                     super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 5;
          local_80.table_index = iVar1;
          make_uniq<duckdb::BoundColumnRefExpression,duckdb::LogicalType_const&,duckdb::ColumnBinding>
                    ((duckdb *)&local_a8,pLVar4,&local_80);
          local_b0._M_head_impl = local_a8;
          local_a8 = (Expression *)0x0;
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                    (local_70,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                               *)&local_b0);
          if (local_b0._M_head_impl != (Expression *)0x0) {
            (*((local_b0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
          }
          local_b0._M_head_impl = (Expression *)0x0;
          if (local_a8 != (Expression *)0x0) {
            (*(local_a8->super_BaseExpression)._vptr_BaseExpression[1])();
          }
          LogicalGet::AddColumnId(local_88,(column_t)*__k);
          ::std::vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>::push_back
                    (&local_a0->
                      super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>,
                     (value_type *)__k);
        }
      }
    }
    ::std::
    _Hashtable<duckdb::PhysicalIndex,_duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::PhysicalIndex>,_duckdb::PhysicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_68);
  }
  return;
}

Assistant:

void LogicalUpdate::BindExtraColumns(TableCatalogEntry &table, LogicalGet &get, LogicalProjection &proj,
                                     LogicalUpdate &update, physical_index_set_t &bound_columns) {
	if (bound_columns.size() <= 1) {
		return;
	}
	idx_t found_column_count = 0;
	physical_index_set_t found_columns;
	for (idx_t i = 0; i < update.columns.size(); i++) {
		if (bound_columns.find(update.columns[i]) != bound_columns.end()) {
			// this column is referenced in the CHECK constraint
			found_column_count++;
			found_columns.insert(update.columns[i]);
		}
	}
	if (found_column_count > 0 && found_column_count != bound_columns.size()) {
		// columns in this CHECK constraint were referenced, but not all were part of the UPDATE
		// add them to the scan and update set
		for (auto &check_column_id : bound_columns) {
			if (found_columns.find(check_column_id) != found_columns.end()) {
				// column is already projected
				continue;
			}
			// column is not projected yet: project it by adding the clause "i=i" to the set of updated columns
			auto &column = table.GetColumns().GetColumn(check_column_id);
			update.expressions.push_back(make_uniq<BoundColumnRefExpression>(
			    column.Type(), ColumnBinding(proj.table_index, proj.expressions.size())));
			proj.expressions.push_back(make_uniq<BoundColumnRefExpression>(
			    column.Type(), ColumnBinding(get.table_index, get.GetColumnIds().size())));
			get.AddColumnId(check_column_id.index);
			update.columns.push_back(check_column_id);
		}
	}
}